

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

void cmSHA1_Final(sha_byte *digest,SHA_CTX *context)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int local_34;
  sha_word32 tmp_1;
  int j;
  sha_word64 tmp;
  sha_byte *psStack_20;
  uint usedspace;
  sha_word32 *d;
  SHA_CTX *context_local;
  sha_byte *digest_local;
  
  if (context == (SHA_CTX *)0x0) {
    __assert_fail("context != (SHA_CTX*)0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cm_sha2.c"
                  ,0x2b9,"void cmSHA1_Final(sha_byte *, SHA_CTX *)");
  }
  if (digest == (sha_byte *)0x0) {
    memset(context,0,0xd0);
  }
  else {
    uVar2 = (context->s1).bitcount >> 3;
    uVar1 = (uint)uVar2 & 0x3f;
    if ((uVar2 & 0x3f) == 0) {
      memset((context->s1).buffer,0,0x38);
      (context->s1).buffer[0] = 0x80;
    }
    else {
      uVar3 = uVar1 + 1;
      *(undefined1 *)((long)context + (ulong)uVar1 + 0x20) = 0x80;
      if (uVar3 < 0x39) {
        memset((void *)((long)context + (ulong)uVar3 + 0x20),0,(ulong)(0x38 - uVar3));
      }
      else {
        if (uVar3 < 0x40) {
          memset((void *)((long)context + (ulong)uVar3 + 0x20),0,(ulong)(0x40 - uVar3));
        }
        cmSHA1_Internal_Transform(context,(sha_word32 *)(context->s1).buffer);
        memset((context->s1).buffer,0,0x38);
      }
    }
    uVar2 = (context->s1).bitcount >> 0x20 | (context->s1).bitcount << 0x20;
    uVar2 = (uVar2 & 0xff00ff00ff00ff00) >> 8 | (uVar2 & 0xff00ff00ff00ff) << 8;
    (context->s1).bitcount = (uVar2 & 0xffff0000ffff0000) >> 0x10 | (uVar2 & 0xffff0000ffff) << 0x10
    ;
    *(cm_sha2_uint64_t *)((context->s1).buffer + 0x38) = (context->s1).bitcount;
    cmSHA1_Internal_Transform(context,(sha_word32 *)(context->s1).buffer);
    psStack_20 = digest;
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      uVar1 = *(uint *)((long)context + (long)local_34 * 4);
      uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
      *(uint *)((long)context + (long)local_34 * 4) =
           (uVar1 & 0xff00ff00) >> 8 | (uVar1 & 0xff00ff) << 8;
      *(undefined4 *)psStack_20 = *(undefined4 *)((long)context + (long)local_34 * 4);
      psStack_20 = psStack_20 + 4;
    }
    memset(context,0,0xd0);
  }
  return;
}

Assistant:

void SHA1_Final(sha_byte digest[], SHA_CTX* context) {
	sha_word32	*d = (sha_word32*)digest;
	unsigned int	usedspace;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	if (digest == (sha_byte*)0) {
		/*
		 * No digest buffer, so we can do nothing
		 * except clean up and go home
		 */
		MEMSET_BZERO(context, sizeof(*context));
		return;
	}

	usedspace = (unsigned int)((context->s1.bitcount >> 3) % 64);
	if (usedspace == 0) {
		/* Set-up for the last transform: */
		MEMSET_BZERO(context->s1.buffer, 56);

		/* Begin padding with a 1 bit: */
		*context->s1.buffer = 0x80;
	} else {
		/* Begin padding with a 1 bit: */
		context->s1.buffer[usedspace++] = 0x80;

		if (usedspace <= 56) {
			/* Set-up for the last transform: */
			MEMSET_BZERO(&context->s1.buffer[usedspace], 56 - usedspace);
		} else {
			if (usedspace < 64) {
				MEMSET_BZERO(&context->s1.buffer[usedspace], 64 - usedspace);
			}
			/* Do second-to-last transform: */
			SHA1_Internal_Transform(context, (const sha_word32*)context->s1.buffer);

			/* And set-up for the last transform: */
			MEMSET_BZERO(context->s1.buffer, 56);
		}
		/* Clean up: */
		usedspace = 0;
	}
	/* Set the bit count: */
#if BYTE_ORDER == LITTLE_ENDIAN
	/* Convert FROM host byte order */
	REVERSE64(context->s1.bitcount,context->s1.bitcount);
#endif
	MEMCPY_BCOPY(&context->s1.buffer[56], &context->s1.bitcount,
		     sizeof(sha_word64));

	/* Final transform: */
	SHA1_Internal_Transform(context, (const sha_word32*)context->s1.buffer);

	/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
	{
		/* Convert TO host byte order */
		int	j;
		for (j = 0; j < (SHA1_DIGEST_LENGTH >> 2); j++) {
			REVERSE32(context->s1.state[j],context->s1.state[j]);
			*d++ = context->s1.state[j];
		}
	}
#else
	MEMCPY_BCOPY(d, context->s1.state, SHA1_DIGEST_LENGTH);
#endif

	/* Clean up: */
	MEMSET_BZERO(context, sizeof(*context));
}